

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::AdvancedMatrixCS::Run(AdvancedMatrixCS *this)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  bool bVar3;
  int i;
  GLuint GVar4;
  GLint GVar5;
  long lVar6;
  void *pvVar7;
  byte bVar8;
  GLfloat data [48];
  string local_f8;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float afStack_78 [18];
  
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Buffer {\n  mat4x3 dst4x3;\n  mat4 dst4;\n  mat4 src4;\n} b;\nuniform int g_index1;\nuniform int g_index2;\nvoid main() {\n  b.dst4x3[gl_LocalInvocationIndex] = b.src4[gl_LocalInvocationIndex].rgb;\n  b.dst4x3[gl_LocalInvocationIndex + 1u] = b.src4[gl_LocalInvocationIndex + 1u].aar;\n  b.dst4[g_index2][g_index1] = 17.0;\n  b.dst4[g_index2][g_index1] += 6.0;\n  b.dst4[3][0] = b.src4[3][0] != 44.0 ? 3.0 : 7.0;\n  b.dst4[3][1] = b.src4[3][1];\n}"
             ,"");
  GVar4 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_f8);
  this->m_program = GVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar3 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  lVar6 = -1;
  if (bVar3) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = 0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    lVar6 = 0x20;
    do {
      *(float *)((long)&local_f8._M_dataplus._M_p + lVar6 * 4) = (float)(int)lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x30);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0xc0,&local_f8,0x88e8);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index1");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_index2");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,2);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0xc0,1);
    if (pvVar7 == (void *)0x0) {
      lVar6 = -1;
    }
    else {
      bVar8 = 1;
      lVar6 = 0;
      do {
        fVar1 = *(float *)((long)pvVar7 + lVar6);
        fVar2 = *(float *)((long)&DAT_01a8b160 + lVar6);
        if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
          anon_unknown_0::Output
                    ("Received: %f, but expected: %f\n",SUB84((double)fVar1,0),(double)fVar2);
          bVar8 = 0;
        }
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x80);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      lVar6 = -(ulong)(~bVar8 & 1);
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		bool			  status = true;
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Buffer {" NL "  mat4x3 dst4x3;" NL
			   "  mat4 dst4;" NL "  mat4 src4;" NL "} b;" NL "uniform int g_index1;" NL "uniform int g_index2;" NL
			   "void main() {" NL "  b.dst4x3[gl_LocalInvocationIndex] = b.src4[gl_LocalInvocationIndex].rgb;" NL
			   "  b.dst4x3[gl_LocalInvocationIndex + 1u] = b.src4[gl_LocalInvocationIndex + 1u].aar;" NL
			   "  b.dst4[g_index2][g_index1] = 17.0;" NL "  b.dst4[g_index2][g_index1] += 6.0;" NL
			   "  b.dst4[3][0] = b.src4[3][0] != 44.0 ? 3.0 : 7.0;" NL "  b.dst4[3][1] = b.src4[3][1];" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		GLfloat data[16 + 16 + 16];
		for (int i  = 0; i < 32; ++i)
			data[i] = 0.0f;
		for (int i  = 32; i < 48; ++i)
			data[i] = (GLfloat)i;
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data[0], GL_DYNAMIC_DRAW);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_index1"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_index2"), 2);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;

		GLfloat expected[32] = { 32.0f, 33.0f, 34.0f, 0.0f, 39.0f, 39.0f, 36.0f, 0.0f,
								 0.0f,  0.0f,  0.0f,  0.0f, 0.0f,  0.0f,  0.0f,  0.0f,

								 0.0f,  0.0f,  0.0f,  0.0f, 0.0f,  0.0f,  0.0f,  0.0f,
								 0.0f,  23.0f, 0.0f,  0.0f, 7.0f,  45.0f, 0.0f,  0.0f };
		for (int i = 0; i < 32; ++i)
		{
			if (out_data[i] != expected[i])
			{
				Output("Received: %f, but expected: %f\n", out_data[i], expected[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}